

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void LzmaEnc_Destruct(CLzmaEnc *p,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  ISzAlloc *in_RDX;
  CLzmaEnc *in_RSI;
  
  MatchFinder_Free((CMatchFinder *)in_RSI,in_RDX);
  LzmaEnc_FreeLits(in_RSI,in_RDX);
  RangeEnc_Free((CRangeEnc *)in_RSI,in_RDX);
  return;
}

Assistant:

void LzmaEnc_Destruct(CLzmaEnc *p, ISzAlloc *alloc, ISzAlloc *allocBig)
{
  #ifndef _7ZIP_ST
  MatchFinderMt_Destruct(&p->matchFinderMt, allocBig);
  #endif
  
  MatchFinder_Free(&p->matchFinderBase, allocBig);
  LzmaEnc_FreeLits(p, alloc);
  RangeEnc_Free(&p->rc, alloc);
}